

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

bool mjs::interpreter::impl::compare_equal(value *l,value *r)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  value_type vVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  uint *puVar11;
  uint *puVar12;
  size_type __rlen;
  value local_48;
  
  vVar3 = l->type_;
  vVar4 = r->type_;
  if (vVar3 == vVar4) {
    bVar7 = 1;
    switch(vVar3) {
    case undefined:
    case null:
      break;
    case boolean:
      bVar7 = (l->field_1).b_ == (r->field_1).b_;
      break;
    case number:
      dVar1 = (l->field_1).n_;
      bVar7 = 0;
      if ((!NAN(dVar1)) && (dVar2 = (r->field_1).n_, !NAN(dVar2))) {
        bVar7 = dVar1 == dVar2 | -(dVar1 == 0.0) & -(dVar2 == 0.0);
      }
      break;
    case string:
      puVar11 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(l->field_1).s_);
      uVar5 = *puVar11;
      puVar12 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(r->field_1).s_);
      if ((uVar5 == *puVar12) &&
         (((ulong)uVar5 == 0 ||
          (iVar8 = wmemcmp((wchar_t *)(puVar11 + 1),(wchar_t *)(puVar12 + 1),(ulong)uVar5),
          iVar8 == 0)))) break;
      goto LAB_001241c4;
    case object:
      pvVar9 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(l->field_1).s_);
      if (r->type_ != object) {
        __assert_fail("type_ == value_type::object",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                      ,0x46,"const object_ptr &mjs::value::object_value() const");
      }
      pvVar10 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(r->field_1).s_);
      bVar7 = pvVar9 == pvVar10;
      break;
    default:
      __assert_fail("l.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x292,
                    "static bool mjs::interpreter::impl::compare_equal(const value &, const value &)"
                   );
    }
  }
  else {
    switch(vVar3) {
    case undefined:
      bVar7 = 1;
      if (vVar4 == null) goto switchD_00123f6e_caseD_0;
      break;
    case null:
      if (vVar4 == undefined) {
        bVar7 = 1;
        goto switchD_00123f6e_caseD_0;
      }
      break;
    case boolean:
      local_48.field_1.n_ = (double)(int)(l->field_1).b_;
      local_48.type_ = number;
      bVar7 = compare_equal(&local_48,r);
      value::destroy(&local_48);
      goto switchD_00123f6e_caseD_0;
    case number:
      if (vVar4 == string) {
        local_48.field_1.n_ = to_number(&(r->field_1).s_);
        local_48.type_ = number;
        bVar7 = compare_equal(l,&local_48);
        value::destroy(&local_48);
        goto switchD_00123f6e_caseD_0;
      }
      bVar6 = 1;
      goto LAB_00124052;
    case string:
      if (vVar4 == number) {
        local_48.field_1.n_ = to_number(&(l->field_1).s_);
        local_48.type_ = number;
        bVar7 = compare_equal(&local_48,r);
        value::destroy(&local_48);
        goto switchD_00123f6e_caseD_0;
      }
      bVar7 = 1;
      bVar6 = 0;
      goto LAB_00124054;
    }
    bVar6 = 0;
LAB_00124052:
    bVar7 = 0;
LAB_00124054:
    if (vVar4 == boolean) {
      local_48.field_1.n_ = (double)(int)(r->field_1).b_;
      local_48.type_ = number;
      bVar7 = compare_equal(l,&local_48);
      value::destroy(&local_48);
      goto switchD_00123f6e_caseD_0;
    }
    if (vVar4 == object && (bool)(bVar6 | bVar7)) {
      to_primitive(&local_48,r,undefined);
      bVar7 = compare_equal(l,&local_48);
      value::destroy(&local_48);
      goto switchD_00123f6e_caseD_0;
    }
    if (vVar3 == object && vVar4 - number < 2) {
      to_primitive(&local_48,l,undefined);
      bVar7 = compare_equal(&local_48,r);
      value::destroy(&local_48);
      goto switchD_00123f6e_caseD_0;
    }
LAB_001241c4:
    bVar7 = 0;
  }
switchD_00123f6e_caseD_0:
  return (bool)(bVar7 & 1);
}

Assistant:

static bool compare_equal(const value& l, const value& r) {
        if (l.type() == r.type()) {
            if (l.type() == value_type::undefined || l.type() == value_type::null) {
                return true;
            } else if (l.type() == value_type::number) {
                const double ln = l.number_value();
                const double rn = r.number_value();
                if (std::isnan(ln) || std::isnan(rn)) {
                    return false;
                }
                if ((ln == 0.0 && rn == 0.0) || ln == rn) {
                    return true;
                }
                return false;
            } else if (l.type() == value_type::string) {
                return l.string_value() == r.string_value();
            } else if (l.type() == value_type::boolean) {
                return l.boolean_value() == r.boolean_value();
            }
            assert(l.type() == value_type::object);
            return l.object_value().get() == r.object_value().get();
        }
        // Types are different
        if (l.type() == value_type::null && r.type() == value_type::undefined) {
            return true;
        } else if (l.type() == value_type::undefined && r.type() == value_type::null) {
            return true;
        } else if (l.type() == value_type::number && r.type() == value_type::string) {
            return compare_equal(l, value{to_number(r.string_value())});
        } else if (l.type() == value_type::string && r.type() == value_type::number) {
            return compare_equal(value{to_number(l.string_value())}, r);
        } else if (l.type() == value_type::boolean) {
            return compare_equal(value{static_cast<double>(l.boolean_value())}, r);
        } else if (r.type() == value_type::boolean) {
            return compare_equal(l, value{static_cast<double>(r.boolean_value())});
        } else if ((l.type() == value_type::string || l.type() == value_type::number) && r.type() == value_type::object) {
            return compare_equal(l, to_primitive(r));
        } else if ((r.type() == value_type::string || r.type() == value_type::number) && l.type() == value_type::object) {
            return compare_equal(to_primitive(l), r);
        }
        return false;
    }